

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O2

void deferred_on_shutdown(void *arg,void *arg2)

{
  fio_defer_task_s task;
  uint8_t uVar1;
  fio_protocol_s *pfVar2;
  int *piVar3;
  fio_data_s *pfVar4;
  long fd;
  long lVar5;
  fio_lock_i ret;
  
  fd = (long)(int)((ulong)arg >> 8);
  lVar5 = fd * 0xa8;
  if (*(long *)((long)fio_data + lVar5 + 0x58) != 0) {
    pfVar2 = protocol_try_lock(fd,FIO_PR_LOCK_TASK);
    pfVar4 = fio_data;
    if (pfVar2 != (fio_protocol_s *)0x0) {
      *(__time_t *)((long)fio_data + lVar5 + 0x60) = (fio_data->last_cycle).tv_sec;
      if ((pfVar2->on_shutdown != (_func_uint8_t_intptr_t_fio_protocol_s_ptr *)0x0) &&
         (uVar1 = (*pfVar2->on_shutdown)((intptr_t)arg,pfVar2), pfVar4 = fio_data, uVar1 != '\0')) {
        if (uVar1 == 0xff) {
          uVar1 = '\0';
        }
        else {
          LOCK();
          fio_data->connection_count = fio_data->connection_count + 1;
          UNLOCK();
        }
        *(uint8_t *)((long)fio_data + lVar5 + 0x6a) = uVar1;
        pfVar2->ping = mock_ping2;
        LOCK();
        *(undefined1 *)&pfVar2->rsv = 0;
        UNLOCK();
        return;
      }
      LOCK();
      pfVar4->connection_count = pfVar4->connection_count + 1;
      UNLOCK();
      *(undefined1 *)((long)fio_data + lVar5 + 0x6a) = 8;
      pfVar2->ping = mock_ping;
      LOCK();
      *(undefined1 *)&pfVar2->rsv = 0;
      UNLOCK();
      fio_close((intptr_t)arg);
      return;
    }
    piVar3 = __errno_location();
    if (*piVar3 != 9) {
      task.arg1 = arg;
      task.func = deferred_on_shutdown;
      task.arg2 = (void *)0x0;
      fio_defer_push_task_fn(task,&task_queue_normal);
    }
  }
  return;
}

Assistant:

static void deferred_on_shutdown(void *arg, void *arg2) {
  if (!uuid_data(arg).protocol) {
    return;
  }
  fio_protocol_s *pr = protocol_try_lock(fio_uuid2fd(arg), FIO_PR_LOCK_TASK);
  if (!pr) {
    if (errno == EBADF)
      return;
    goto postpone;
  }
  touchfd(fio_uuid2fd(arg));
  uint8_t r = pr->on_shutdown ? pr->on_shutdown((intptr_t)arg, pr) : 0;
  if (r) {
    if (r == 255) {
      uuid_data(arg).timeout = 0;
    } else {
      fio_atomic_add(&fio_data->connection_count, 1);
      uuid_data(arg).timeout = r;
    }
    pr->ping = mock_ping2;
    protocol_unlock(pr, FIO_PR_LOCK_TASK);
  } else {
    fio_atomic_add(&fio_data->connection_count, 1);
    uuid_data(arg).timeout = 8;
    pr->ping = mock_ping;
    protocol_unlock(pr, FIO_PR_LOCK_TASK);
    fio_close((intptr_t)arg);
  }
  return;
postpone:
  fio_defer_push_task(deferred_on_shutdown, arg, NULL);
  (void)arg2;
}